

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_destroy.c
# Opt level: O0

void ares_destroy_servers_state(ares_channel_t *channel)

{
  ares_slist_node_t *node_00;
  ares_server_t *server_00;
  ares_server_t *server;
  ares_slist_node_t *node;
  ares_channel_t *channel_local;
  
  while( true ) {
    node_00 = ares_slist_node_first(channel->servers);
    if (node_00 == (ares_slist_node_t *)0x0) break;
    server_00 = (ares_server_t *)ares_slist_node_claim(node_00);
    ares_destroy_server(server_00);
  }
  ares_slist_destroy(channel->servers);
  channel->servers = (ares_slist_t *)0x0;
  return;
}

Assistant:

void ares_destroy_servers_state(ares_channel_t *channel)
{
  ares_slist_node_t *node;

  while ((node = ares_slist_node_first(channel->servers)) != NULL) {
    ares_server_t *server = ares_slist_node_claim(node);
    ares_destroy_server(server);
  }

  ares_slist_destroy(channel->servers);
  channel->servers = NULL;
}